

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_sse2.c
# Opt level: O0

void prepare_filter_coeffs(int16_t *filter,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i filter_8bit;
  __m128i tmp1;
  __m128i tmp0;
  __m128i sym_even_filter;
  __m256i *coeffs_local;
  int16_t *filter_local;
  undefined2 local_28;
  undefined2 local_18;
  
  auVar2._8_8_ = *(undefined8 *)filter;
  auVar2._0_8_ = *(undefined8 *)filter;
  auVar2 = vpshufhw_avx(auVar2,0xb1);
  auVar2 = vpacksswb_avx(auVar2,auVar2);
  local_18 = auVar2._0_2_;
  *(undefined2 *)coeffs[2] = local_18;
  *(undefined2 *)((long)coeffs[2] + 2) = local_18;
  *(undefined2 *)((long)coeffs[2] + 4) = local_18;
  *(undefined2 *)((long)coeffs[2] + 6) = local_18;
  *(undefined2 *)(coeffs[2] + 1) = local_18;
  *(undefined2 *)((long)coeffs[2] + 10) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0xc) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0xe) = local_18;
  *(undefined2 *)(coeffs[2] + 2) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x12) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x14) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x16) = local_18;
  *(undefined2 *)(coeffs[2] + 3) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x1a) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x1c) = local_18;
  *(undefined2 *)((long)coeffs[2] + 0x1e) = local_18;
  auVar1 = vpsrldq_avx(auVar2,2);
  local_28 = auVar1._0_2_;
  *(undefined2 *)coeffs[3] = local_28;
  *(undefined2 *)((long)coeffs[3] + 2) = local_28;
  *(undefined2 *)((long)coeffs[3] + 4) = local_28;
  *(undefined2 *)((long)coeffs[3] + 6) = local_28;
  *(undefined2 *)(coeffs[3] + 1) = local_28;
  *(undefined2 *)((long)coeffs[3] + 10) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0xc) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0xe) = local_28;
  *(undefined2 *)(coeffs[3] + 2) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x12) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x14) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x16) = local_28;
  *(undefined2 *)(coeffs[3] + 3) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x1a) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x1c) = local_28;
  *(undefined2 *)((long)coeffs[3] + 0x1e) = local_28;
  auVar1 = vpsrldq_avx(auVar2,6);
  filter_local._0_2_ = auVar1._0_2_;
  *(undefined2 *)*coeffs = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 2) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 4) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 6) = filter_local._0_2_;
  *(undefined2 *)(*coeffs + 1) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 10) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0xc) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0xe) = filter_local._0_2_;
  *(undefined2 *)(*coeffs + 2) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x12) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x14) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x16) = filter_local._0_2_;
  *(undefined2 *)(*coeffs + 3) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x1a) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x1c) = filter_local._0_2_;
  *(undefined2 *)((long)*coeffs + 0x1e) = filter_local._0_2_;
  auVar2 = vpsrldq_avx(auVar2,4);
  sym_even_filter[1]._0_2_ = auVar2._0_2_;
  *(undefined2 *)coeffs[1] = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 2) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 4) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 6) = (undefined2)sym_even_filter[1];
  *(undefined2 *)(coeffs[1] + 1) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 10) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0xc) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0xe) = (undefined2)sym_even_filter[1];
  *(undefined2 *)(coeffs[1] + 2) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x12) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x14) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x16) = (undefined2)sym_even_filter[1];
  *(undefined2 *)(coeffs[1] + 3) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x1a) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x1c) = (undefined2)sym_even_filter[1];
  *(undefined2 *)((long)coeffs[1] + 0x1e) = (undefined2)sym_even_filter[1];
  return;
}

Assistant:

static inline void prepare_filter_coeffs(const int16_t *filter,
                                         __m128i *const coeffs /* [2] */) {
  // f0 f1 f2 f3 x x x x
  const __m128i sym_even_filter = _mm_loadl_epi64((__m128i *)filter);

  // f1 f0 f3 f2 x x x x
  const __m128i tmp1 = _mm_shufflelo_epi16(sym_even_filter, 0xb1);

  // f3 f2 f3 f2 ...
  coeffs[0] = _mm_shuffle_epi32(tmp1, 0x55);
  // f1 f0 f1 f0 ...
  coeffs[1] = _mm_shuffle_epi32(tmp1, 0x00);
}